

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void print_live_ranges(gen_ctx_t gen_ctx,live_range_t_conflict lr)

{
  live_range_t_conflict local_18;
  live_range_t_conflict lr_local;
  gen_ctx_t gen_ctx_local;
  
  for (local_18 = lr; local_18 != (live_range_t_conflict)0x0; local_18 = local_18->next) {
    print_live_range(gen_ctx,local_18);
  }
  fprintf((FILE *)gen_ctx->debug_file,"\n");
  return;
}

Assistant:

static void print_live_ranges (gen_ctx_t gen_ctx, live_range_t lr) {
  for (; lr != NULL; lr = lr->next) print_live_range (gen_ctx, lr);
  fprintf (debug_file, "\n");
}